

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  undefined8 extraout_RAX;
  ostream *poVar1;
  
  sort_5_4::test();
  __cxa_begin_catch(extraout_RAX);
  poVar1 = std::operator<<((ostream *)&std::cout,"catch (...)");
  std::endl<char,std::char_traits<char>>(poVar1);
  __cxa_end_catch();
  return 0;
}

Assistant:

int main() {
    try {
        //    ds_1::run();//大话数据结构
//    ds_22::run();//啊哈！算法
//    ds_3::run();//妙趣横生的算法
//    ds_4::test();//数据结构与算法分析
//    ds_5::test();//数据结构 one
//    ds_5_1::test();//数据结构 two
//    sort_5_2::test();
//        run_3::test();
        r4::test();
        return 0;
    } catch (...) {
        std::cout << "catch (...)" << std::endl;

    }

}